

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonnetfmt.cpp
# Opt level: O2

void usage(ostream *o)

{
  version(o);
  std::operator<<(o,"\n");
  std::operator<<(o,"jsonnetfmt {<option>} { <filename> }\n");
  std::operator<<(o,"\n");
  std::operator<<(o,"Available options:\n");
  std::operator<<(o,"  -h / --help             This message\n");
  std::operator<<(o,"  -e / --exec             Treat filename as code\n");
  std::operator<<(o,"  -o / --output-file <file> Write to the output file rather than stdout\n");
  std::operator<<(o,"  -i / --in-place         Update the Jsonnet file(s) in place.\n");
  std::operator<<(o,
                  "  --test                  Exit with failure if reformatting changed the file(s).\n"
                 );
  std::operator<<(o,
                  "  -n / --indent <n>       Number of spaces to indent by (default 2, 0 means no change)\n"
                 );
  std::operator<<(o,
                  "  --max-blank-lines <n>   Max vertical spacing, 0 means no change (default 2)\n")
  ;
  std::operator<<(o,
                  "  --string-style <d|s|l>  Enforce double, single (default) quotes or \'leave\'\n"
                 );
  std::operator<<(o,
                  "  --comment-style <h|s|l> # (h), // (s)(default), or \'leave\'; never changes she-bang\n"
                 );
  std::operator<<(o,
                  "  --[no-]pretty-field-names Use syntax sugar for fields and indexing (on by default)\n"
                 );
  std::operator<<(o,"  --[no-]pad-arrays       [ 1, 2, 3 ] instead of [1, 2, 3]\n");
  std::operator<<(o,
                  "  --[no-]pad-objects      { x: 1, y: 2 } instead of {x: 1, y: 2} (on by default)\n"
                 );
  std::operator<<(o,"  --[no-]sort-imports     Sorting of imports (on by default)\n");
  std::operator<<(o,"  --debug-desugaring      Unparse the desugared AST without executing it\n");
  std::operator<<(o,"  --version               Print version\n");
  std::operator<<(o,"\n");
  std::operator<<(o,"In all cases:\n");
  std::operator<<(o,"<filename> can be - (stdin)\n");
  std::operator<<(o,"Multichar options are expanded e.g. -abc becomes -a -b -c.\n");
  std::operator<<(o,"The -- option suppresses option processing for subsequent arguments.\n");
  std::operator<<(o,
                  "Note that since filenames and jsonnet programs can begin with -, it is advised to\n"
                 );
  std::operator<<(o,"use -- if the argument is unknown, e.g. jsonnet -- \"$FILENAME\".");
  std::endl<char,std::char_traits<char>>(o);
  return;
}

Assistant:

void usage(std::ostream &o)
{
    version(o);
    o << "\n";
    o << "jsonnetfmt {<option>} { <filename> }\n";
    o << "\n";
    o << "Available options:\n";
    o << "  -h / --help             This message\n";
    o << "  -e / --exec             Treat filename as code\n";
    o << "  -o / --output-file <file> Write to the output file rather than stdout\n";
    o << "  -i / --in-place         Update the Jsonnet file(s) in place.\n";
    o << "  --test                  Exit with failure if reformatting changed the file(s).\n";
    o << "  -n / --indent <n>       Number of spaces to indent by (default 2, 0 means no change)\n";
    o << "  --max-blank-lines <n>   Max vertical spacing, 0 means no change (default 2)\n";
    o << "  --string-style <d|s|l>  Enforce double, single (default) quotes or 'leave'\n";
    o << "  --comment-style <h|s|l> # (h), // (s)(default), or 'leave'; never changes she-bang\n";
    o << "  --[no-]pretty-field-names Use syntax sugar for fields and indexing (on by default)\n";
    o << "  --[no-]pad-arrays       [ 1, 2, 3 ] instead of [1, 2, 3]\n";
    o << "  --[no-]pad-objects      { x: 1, y: 2 } instead of {x: 1, y: 2} (on by default)\n";
    o << "  --[no-]sort-imports     Sorting of imports (on by default)\n";
    o << "  --debug-desugaring      Unparse the desugared AST without executing it\n";
    o << "  --version               Print version\n";
    o << "\n";
    o << "In all cases:\n";
    o << "<filename> can be - (stdin)\n";
    o << "Multichar options are expanded e.g. -abc becomes -a -b -c.\n";
    o << "The -- option suppresses option processing for subsequent arguments.\n";
    o << "Note that since filenames and jsonnet programs can begin with -, it is advised to\n";
    o << "use -- if the argument is unknown, e.g. jsonnet -- \"$FILENAME\".";
    o << std::endl;
}